

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc.cc
# Opt level: O0

void absl::lts_20250127::crc_internal::CRCImpl::FillWordTable
               (uint32_t poly,uint32_t last,int word_size,Uint32By256 *t)

{
  int local_34;
  int local_30;
  int k;
  int i_1;
  uint32_t pred;
  int i;
  int j;
  Uint32By256 *t_local;
  int word_size_local;
  uint32_t last_local;
  uint32_t poly_local;
  
  for (pred = 0; pred != word_size; pred = pred + 1) {
    t[(int)pred][0] = 0;
    for (i_1 = 0x80; i_1 != 0; i_1 = i_1 >> 1) {
      if ((pred == 0) && (i_1 == 0x80)) {
        (*t)[0x80] = last;
      }
      else {
        if (i_1 == 0x80) {
          k = t[(int)(pred - 1)][1];
        }
        else {
          k = t[(int)pred][i_1 << 1];
        }
        if ((k & 1U) == 0) {
          t[(int)pred][i_1] = (uint)k >> 1;
        }
        else {
          t[(int)pred][i_1] = (uint)k >> 1 ^ poly;
        }
      }
    }
    for (local_30 = 2; local_34 = local_30, local_30 != 0x100; local_30 = local_30 << 1) {
      while (local_34 = local_34 + 1, local_34 != local_30 * 2) {
        t[(int)pred][local_34] = t[(int)pred][local_30] ^ t[(int)pred][local_34 - local_30];
      }
    }
  }
  return;
}

Assistant:

void CRCImpl::FillWordTable(uint32_t poly, uint32_t last, int word_size,
                            Uint32By256* t) {
  for (int j = 0; j != word_size; j++) {  // for each byte of extension....
    t[j][0] = 0;                          // a zero has no effect
    for (int i = 128; i != 0; i >>= 1) {  // fill in entries for powers of 2
      if (j == 0 && i == 128) {
        t[j][i] = last;  // top bit in last byte is given
      } else {
        // each successive power of two is derived from the previous
        // one, either in this table, or the last table
        uint32_t pred;
        if (i == 128) {
          pred = t[j - 1][1];
        } else {
          pred = t[j][i << 1];
        }
        // Advance the CRC by one bit (multiply by X, and take remainder
        // through one step of polynomial long division)
        if (pred & 1) {
          t[j][i] = (pred >> 1) ^ poly;
        } else {
          t[j][i] = pred >> 1;
        }
      }
    }
    // CRCs have the property that CRC(a xor b) == CRC(a) xor CRC(b)
    // so we can make all the tables for non-powers of two by
    // xoring previously created entries.
    for (int i = 2; i != 256; i <<= 1) {
      for (int k = i + 1; k != (i << 1); k++) {
        t[j][k] = t[j][i] ^ t[j][k - i];
      }
    }
  }
}